

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

string * tinyusdz::detail::to_xml_string<tinyusdz::value::color3f>
                   (string *__return_storage_ptr__,color3f *val)

{
  string local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  color3f *local_18;
  color3f *val_local;
  
  local_18 = val;
  val_local = (color3f *)__return_storage_ptr__;
  dtos_abi_cxx11_(&local_98,(double)val->r);
  ::std::operator+(local_78,(char *)&local_98);
  dtos_abi_cxx11_(&local_b8,(double)local_18->g);
  ::std::operator+(local_58,local_78);
  ::std::operator+(local_38,(char *)local_58);
  dtos_abi_cxx11_(&local_d8,(double)local_18->b);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,local_38);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)local_38);
  ::std::__cxx11::string::~string((string *)local_58);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string to_xml_string(const value::color3f &val) {
  return dtos(double(val.r)) + ", " + dtos(double(val.g)) + ", " +
         dtos(double(val.b));
}